

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution2D.cpp
# Opt level: O3

void __thiscall layer::Convolution2D::propagate(Convolution2D *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  tensor ppplVar7;
  tensor *pppplVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  longdouble *plVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  Convolution2D *pCVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  longdouble in_ST0;
  longdouble lVar23;
  longdouble in_ST1;
  longdouble lVar24;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar25;
  undefined6 in_stack_ffffffffffffff82;
  long local_70;
  int local_48;
  
  iVar13 = (this->super_Layer)._sizeZOut;
  if (0 < iVar13) {
    iVar11 = (this->super_Layer)._sizeYOut;
    lVar21 = 0;
    do {
      if (0 < iVar11) {
        uVar22 = (ulong)(uint)(this->super_Layer)._sizeXOut;
        local_70 = 0;
        do {
          if (0 < (int)uVar22) {
            plVar12 = (this->super_Layer)._out[lVar21][local_70];
            lVar16 = 0;
            lVar23 = in_ST1;
            do {
              in_ST1 = in_ST3;
              lVar24 = (longdouble)0;
              plVar12[lVar16] = lVar24;
              lVar14 = (long)(this->super_Layer)._sizeZWeight;
              pCVar18 = this;
              in_ST3 = in_ST5;
              lVar25 = in_ST5;
              if (0 < lVar14) {
                iVar13 = this->_stepY;
                iVar11 = this->_zeroPaddingY;
                uVar1 = (this->super_Layer)._sizeYWeight;
                iVar2 = this->_sizeYIn;
                lVar24 = (longdouble)0;
                lVar19 = 0;
                do {
                  if (0 < (int)uVar1) {
                    iVar3 = this->_stepX;
                    local_48 = (int)lVar16;
                    iVar4 = this->_zeroPaddingX;
                    uVar5 = (this->super_Layer)._sizeXWeight;
                    iVar6 = this->_sizeXIn;
                    uVar22 = 0;
                    uVar15 = iVar13 * (int)local_70 - iVar11;
                    do {
                      if ((-1 < (int)uVar15 && 0 < (int)uVar5) && (int)uVar15 < iVar2) {
                        ppplVar7 = (this->super_Layer)._in;
                        pppplVar8 = (this->super_Layer)._ptrWeight;
                        lVar17 = 0;
                        uVar20 = iVar3 * local_48 - iVar4;
                        do {
                          if ((-1 < (int)uVar20) && ((int)uVar20 < iVar6)) {
                            pCVar18 = (Convolution2D *)ppplVar7[lVar19][uVar15];
                            lVar24 = *(longdouble *)
                                      (&(pCVar18->super_Layer)._vptr_Layer + (ulong)uVar20 * 2) *
                                     *(longdouble *)
                                      ((long)pppplVar8[lVar21][lVar19][uVar22] + lVar17) + lVar24;
                            plVar12[lVar16] = lVar24;
                            in_ST3 = in_ST4;
                            lVar25 = in_ST4;
                          }
                          uVar20 = uVar20 + 1;
                          lVar17 = lVar17 + 0x10;
                        } while ((ulong)uVar5 << 4 != lVar17);
                      }
                      uVar15 = uVar15 + 1;
                      uVar22 = uVar22 + 1;
                    } while (uVar22 != uVar1);
                  }
                  lVar19 = lVar19 + 1;
                } while (lVar19 != lVar14);
              }
              auVar9._10_6_ = in_stack_ffffffffffffff82;
              auVar9._0_10_ = lVar24;
              in_ST5 = lVar25;
              (*(this->super_Layer)._fDerivative)((scalar *)pCVar18,(scalar)auVar9);
              (this->super_Layer)._derivative[lVar21][local_70][lVar16] = in_ST0;
              auVar10._10_6_ = in_stack_ffffffffffffff82;
              auVar10._0_10_ = (this->super_Layer)._out[lVar21][local_70][lVar16];
              in_ST0 = in_ST2;
              in_ST2 = in_ST4;
              in_ST4 = lVar25;
              (*(this->super_Layer)._fActivation)((scalar *)pCVar18,(scalar)auVar10);
              plVar12 = (this->super_Layer)._out[lVar21][local_70];
              plVar12[lVar16] = lVar23;
              lVar16 = lVar16 + 1;
              uVar22 = (ulong)(this->super_Layer)._sizeXOut;
              lVar23 = in_ST1;
            } while (lVar16 < (long)uVar22);
            iVar11 = (this->super_Layer)._sizeYOut;
          }
          local_70 = local_70 + 1;
        } while (local_70 < iVar11);
        iVar13 = (this->super_Layer)._sizeZOut;
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < iVar13);
  }
  return;
}

Assistant:

void Convolution2D::propagate()
    {
        int posXIn = 0;
        int posYIn = 0;


        for (int posZOut(0); posZOut < _sizeZOut; posZOut++) {
            for (int posYOut(0); posYOut < _sizeYOut; posYOut++) {
                for (int posXOut(0); posXOut < _sizeXOut; posXOut++) {
                    _out[posZOut][posYOut][posXOut] = 0;

                    for (int posZKernel(0); posZKernel < _sizeZWeight; posZKernel++) {
                        posYIn = (posYOut * _stepY) - _zeroPaddingY;
                        for (int posYKernel(0); posYKernel < _sizeYWeight; posYKernel++) {
                            if((posYIn >= 0) & (posYIn < _sizeYIn)) {
                                posXIn = (posXOut * _stepX) - _zeroPaddingX;
                                for (int posXKernel(0); posXKernel < _sizeXWeight; posXKernel++) {
                                    if((posXIn >= 0) & (posXIn < _sizeXIn)) {
                                                  _out[posZOut][posYOut][posXOut] +=
                                                _ptrWeight[posZOut][posZKernel][posYKernel][posXKernel] *
                                                _in[posZKernel][posYIn][posXIn];
                                    }
                                    posXIn++;
                                }
                            }
                            posYIn++;
                        }
                    }
                    _derivative[posZOut][posYOut][posXOut] = _fDerivative(_out[posZOut][posYOut][posXOut]);
                    _out[posZOut][posYOut][posXOut] = _fActivation(_out[posZOut][posYOut][posXOut]);

                }
            }
        }
    }